

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_DACCtrl_Setup(VGMPlayer *this)

{
  byte bVar1;
  byte bVar2;
  UINT8 UVar3;
  UINT16 Command;
  size_type sVar4;
  reference pvVar5;
  CHIP_DEVICE *devInf;
  CHIP_DEVICE *destChip;
  UINT16 chipCmd;
  UINT8 chipID;
  UINT8 chipType;
  DACSTRM_DEV *dacStrm;
  undefined1 auStack_60 [7];
  UINT8 retVal;
  DACSTRM_DEV dacStrm_1;
  DEV_GEN_CFG devCfg;
  size_t dsID;
  VGMPlayer *this_local;
  
  devCfg._8_8_ = this->_dacStrmMap[this->_fileData[(ulong)this->_filePos + 1]];
  if (devCfg._8_8_ == 0xffffffffffffffff) {
    if (this->_fileData[(ulong)this->_filePos + 1] == 0xff) {
      return;
    }
    dacStrm_1.lastItem = 0;
    dacStrm_1.maxItems._0_1_ = 0;
    dacStrm_1.maxItems._1_1_ = 0;
    UVar3 = device_start_daccontrol((DEV_GEN_CFG *)&dacStrm_1.lastItem,(DEV_INFO *)auStack_60);
    if (UVar3 != '\0') {
      return;
    }
    (**(code **)(dacStrm_1.defInf._8_8_ + 0x28))(_auStack_60);
    dacStrm_1.defInf.linkDevs._0_1_ = this->_fileData[(ulong)this->_filePos + 1];
    dacStrm_1.defInf.linkDevs._1_1_ = 0xff;
    dacStrm_1.defInf.linkDevs._2_1_ = 0;
    dacStrm_1.defInf.linkDevs._4_4_ = 0;
    dacStrm_1.streamID = 0xff;
    dacStrm_1.bankID = 0xff;
    dacStrm_1.pbMode = 0xff;
    dacStrm_1._43_1_ = 0xff;
    dacStrm_1.freq = 0;
    sVar4 = std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::size
                      (&this->_dacStreams);
    this->_dacStrmMap[(byte)dacStrm_1.defInf.linkDevs] = sVar4;
    std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::push_back
              (&this->_dacStreams,(value_type *)auStack_60);
    devCfg._8_8_ = this->_dacStrmMap[(byte)dacStrm_1.defInf.linkDevs];
  }
  pvVar5 = std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::operator[]
                     (&this->_dacStreams,devCfg._8_8_);
  bVar1 = this->_fileData[(ulong)this->_filePos + 2];
  bVar2 = this->_fileData[(ulong)this->_filePos + 2];
  Command = ReadBE16(this->_fileData + (ulong)this->_filePos + 3);
  devInf = GetDevicePtr(this,bVar1 & 0x7f,(UINT8)((int)(bVar2 & 0x80) >> 7));
  if (devInf != (CHIP_DEVICE *)0x0) {
    daccontrol_setup_chip((pvVar5->defInf).dataPtr,(DEV_INFO *)devInf,devInf->chipType,Command);
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_DACCtrl_Setup(void)	// DAC Stream Control: Setup Chip
{
	size_t dsID = _dacStrmMap[fData[0x01]];
	if (dsID == (size_t)-1)
	{
		if (fData[0x01] == 0xFF)
			return;
		
		DEV_GEN_CFG devCfg;
		DACSTRM_DEV dacStrm;
		UINT8 retVal;
		
		devCfg.emuCore = 0x00;
		devCfg.srMode = DEVRI_SRMODE_NATIVE;
		devCfg.flags = 0x00;
		devCfg.clock = 0;
		devCfg.smplRate = _outSmplRate;
		retVal = device_start_daccontrol(&devCfg, &dacStrm.defInf);
		if (retVal)
			return;
		dacStrm.defInf.devDef->Reset(dacStrm.defInf.dataPtr);
		dacStrm.streamID = fData[0x01];
		dacStrm.bankID = 0xFF;
		dacStrm.pbMode = 0x00;
		dacStrm.freq = 0;
		dacStrm.lastItem = (UINT32)-1;
		dacStrm.maxItems = 0;
		
		_dacStrmMap[dacStrm.streamID] = _dacStreams.size();
		_dacStreams.push_back(dacStrm);
		
		dsID = _dacStrmMap[dacStrm.streamID];
	}
	
	DACSTRM_DEV* dacStrm = &_dacStreams[dsID];
	UINT8 chipType = fData[0x02] & 0x7F;
	UINT8 chipID = (fData[0x02] & 0x80) >> 7;
	UINT16 chipCmd = ReadBE16(&fData[0x03]);
	CHIP_DEVICE* destChip = GetDevicePtr(chipType, chipID);
	if (destChip == NULL)
		return;
	
	daccontrol_setup_chip(dacStrm->defInf.dataPtr, &destChip->base.defInf, destChip->chipType, chipCmd);
	return;
}